

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

int __thiscall
CVmObject::getp_propdef
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  unsigned_short uVar1;
  int iVar2;
  int iVar3;
  vm_datatype_t vVar4;
  anon_struct_4_2_5f0bc21f_for_bifptr aVar5;
  bool bVar6;
  vm_obj_id_t source_obj;
  vm_val_t val;
  uint local_3c;
  vm_datatype_t local_38;
  undefined4 uStack_34;
  anon_struct_4_2_5f0bc21f_for_bifptr aStack_30;
  undefined4 uStack_2c;
  
  if (in_argc == (uint *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = 1 < *in_argc;
  }
  if (getp_propdef(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0')
  {
    getp_propdef();
  }
  iVar2 = get_prop_check_argc(retval,in_argc,&getp_propdef::desc);
  if (iVar2 != 0) {
    return 1;
  }
  local_38 = sp_[-1].typ;
  uStack_34 = *(undefined4 *)&sp_[-1].field_0x4;
  aStack_30 = sp_[-1].val.bifptr;
  uStack_2c = *(undefined4 *)((long)&sp_[-1].val + 4);
  if (local_38 != VM_PROP) {
    sp_ = sp_ + -1;
    err_throw(0x7db);
  }
  uVar1 = aStack_30.set_idx;
  if (bVar6) {
    local_38 = sp_[-2].typ;
    uStack_34 = *(undefined4 *)&sp_[-2].field_0x4;
    aVar5 = (anon_struct_4_2_5f0bc21f_for_bifptr)sp_[-2].val.obj;
    uStack_2c = *(undefined4 *)((long)&sp_[-2].val + 4);
    aStack_30 = aVar5;
    if (local_38 != VM_INT) {
      sp_ = sp_ + -2;
      err_throw(0x7d5);
    }
    local_38 = VM_INT;
    sp_ = sp_ + -2;
  }
  else {
    aVar5.set_idx = 1;
    aVar5.func_idx = 0;
    local_38 = VM_PROP;
    sp_ = sp_ + -1;
  }
  local_3c = 0;
  iVar2 = (*this->_vptr_CVmObject[0xd])(this,(ulong)uVar1,&local_38,self,&local_3c,0);
  if ((iVar2 != 0) &&
     (iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[local_3c >> 0xc][local_3c & 0xfff].ptr_ +
                          8))(G_obj_table_X.pages_[local_3c >> 0xc] + (local_3c & 0xfff),
                              CVmObjIntClsMod::metaclass_reg_), iVar3 != 0)) {
    local_3c = (*this->_vptr_CVmObject[0x3a])(this,self,(ulong)local_3c);
  }
  switch(aVar5) {
  case (anon_struct_4_2_5f0bc21f_for_bifptr)0x1:
    vVar4 = VM_TRUE - (iVar2 == 0);
    goto LAB_00271b80;
  case (anon_struct_4_2_5f0bc21f_for_bifptr)0x2:
    bVar6 = local_3c == self;
    break;
  case (anon_struct_4_2_5f0bc21f_for_bifptr)0x3:
    bVar6 = local_3c != self;
    break;
  case (anon_struct_4_2_5f0bc21f_for_bifptr)0x4:
    if (iVar2 != 0) {
      if (local_3c != 0) {
        self = local_3c;
      }
      retval->typ = VM_OBJ;
      (retval->val).obj = self;
      return 1;
    }
    retval->typ = VM_NIL;
    return 1;
  default:
    err_throw(0x902);
  }
  vVar4 = (byte)(bVar6 & iVar2 != 0) + VM_NIL;
LAB_00271b80:
  retval->typ = vVar4;
  return 1;
}

Assistant:

int CVmObject::getp_propdef(VMG_ vm_obj_id_t self,
                            vm_val_t *retval, uint *in_argc,
                            vm_prop_id_t, vm_obj_id_t *)
{
    uint argc = (in_argc != 0 ? *in_argc : 0);
    vm_val_t val;
    int flags;
    int found;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    static CVmNativeCodeDesc desc(1, 1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* if we have the flag argument, get it; otherwise, use the default */
    if (argc >= 2)
    {
        /* get the flag value */
        G_interpreter->pop_int(vmg_ &val);
        flags = (int)val.val.intval;
    }
    else
    {
        /* use the default flags */
        flags = VMOBJ_PROPDEF_ANY;
    }

    /* presume we won't find a valid source object */
    source_obj = VM_INVALID_OBJ;

    /* look up the property */
    found = get_prop(vmg_ prop, &val, self, &source_obj, 0);

    /* 
     *   If we found a result, check to see if it's an intrinsic class
     *   modifier object.  If it is, replace it with its intrinsic class:
     *   modifier objects are invisible through the reflection mechanism, and
     *   appear to be the actual intrinsic classes they modify.  
     */
    if (found && CVmObjIntClsMod::is_intcls_mod_obj(vmg_ source_obj))
        source_obj = find_intcls_for_mod(vmg_ self, source_obj);

    /* check the flags */
    switch(flags)
    {
    case VMOBJ_PROPDEF_ANY:
        /* return true if the property is defined */
        retval->set_logical(found);
        break;

    case VMOBJ_PROPDEF_DIRECTLY:
        /* return true if the property is defined directly */
        retval->set_logical(found && source_obj == self);
        break;
        
    case VMOBJ_PROPDEF_INHERITS:
        /* return true if the property is inherited only */
        retval->set_logical(found && source_obj != self);
        break;

    case VMOBJ_PROPDEF_GET_CLASS:
        /* return the defining class, or nil if it's not defined */
        if (found)
        {
            /* 
             *   If we got a valid source object, return it.  If we didn't
             *   get a valid source object, but we found the property,
             *   return 'self' as the result; this isn't exactly right, but
             *   this should only be possible when the source object is an
             *   intrinsic class for which no intrinsic class object is
             *   defined, in which case the best we can do is provide 'self'
             *   as the answer.  
             */
            retval->set_obj(source_obj != VM_INVALID_OBJ ? source_obj : self);
        }
        else
        {
            /* didn't find it - the return value is nil */
            retval->set_nil();
        }
        break;

    default:
        /* other flags are invalid */
        err_throw(VMERR_BAD_VAL_BIF);
        break;
    }